

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

String * __thiscall
kj::PathPtr::toWin32StringImpl
          (String *__return_storage_ptr__,PathPtr *this,bool absolute,bool forApi)

{
  bool bVar1;
  bool bVar2;
  size_t i;
  long lVar3;
  ulong uVar4;
  char *pcVar5;
  Path *this_00;
  char *pcVar6;
  undefined7 in_register_00000011;
  char (*params) [3];
  size_t extraout_RDX_00;
  ulong uVar7;
  char *__n;
  size_t extraout_RDX_01;
  size_t extraout_RDX_02;
  String *p;
  String *pSVar8;
  long lVar9;
  size_t sVar10;
  char *__src;
  Path *pPVar11;
  byte bVar12;
  String *p_1;
  String *pSVar13;
  ArrayPtr<const_char> part;
  ArrayPtr<const_char> part_00;
  StringPtr part_01;
  size_t sVar14;
  DebugExpression<bool> _kjCondition;
  undefined7 uStack_7f;
  DebugExpression<bool> _kjCondition_1;
  Fault f;
  size_t extraout_RDX;
  
  part.size_._1_7_ = in_register_00000011;
  part.size_._0_1_ = absolute;
  sVar14 = (this->parts).size_;
  if (sVar14 == 0) {
    __kjCondition = (char *)CONCAT71(uStack_7f,!absolute);
    if (absolute) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[41]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,200,FAILED,"!absolute","_kjCondition,\"absolute path is missing disk designator\""
                 ,&_kjCondition,(char (*) [41])"absolute path is missing disk designator");
      kj::_::Debug::Fault::~Fault(&f);
      str<char_const(&)[3]>(__return_storage_ptr__,(kj *)"\\\\",params);
      return __return_storage_ptr__;
    }
    str<char_const(&)[2]>
              (__return_storage_ptr__,(kj *)0x1e4a32,
               (char (*) [2])(CONCAT71(in_register_00000011,absolute) ^ 1));
    return __return_storage_ptr__;
  }
  pSVar8 = (this->parts).ptr;
  if (absolute) {
    pPVar11 = (Path *)(pSVar8->content).size_;
    this_00 = pPVar11;
    if (pPVar11 != (Path *)0x0) {
      this_00 = (Path *)(pSVar8->content).ptr;
    }
    pcVar5 = (char *)0x0;
    if (pPVar11 != (Path *)0x0) {
      pcVar5 = (char *)((long)&pPVar11[-1].parts.disposer + 7);
    }
    part.ptr = pcVar5;
    bVar1 = Path::isWin32Drive(this_00,part);
    if ((!bVar1) &&
       (part_00.size_ = extraout_RDX, part_00.ptr = pcVar5,
       bVar2 = Path::isNetbiosName(this_00,part_00), !bVar2)) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[70],kj::String_const&>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0xd6,FAILED,(char *)0x0,
                 "\"absolute win32 path must start with drive letter or netbios host name\", parts[0]"
                 ,(char (*) [70])
                  "absolute win32 path must start with drive letter or netbios host name",pSVar8);
      kj::_::Debug::Fault::fatal(&f);
    }
    bVar2 = !bVar1;
    if (forApi) {
      uVar4 = ((ulong)bVar1 ^ 1) * 4 + 4;
      bVar12 = 1;
    }
    else {
      uVar4 = (ulong)((bVar1 ^ 1) * 2);
      bVar12 = 0;
    }
  }
  else {
    uVar4 = 0;
    bVar12 = 0;
    bVar2 = false;
  }
  sVar10 = (uVar4 + sVar14) - 1;
  for (lVar3 = sVar14 * 0x18; lVar3 != 0; lVar3 = lVar3 + -0x18) {
    sVar14 = (pSVar8->content).size_;
    lVar9 = sVar14 - 1;
    if (sVar14 == 0) {
      lVar9 = 0;
    }
    sVar10 = sVar10 + lVar9;
    pSVar8 = pSVar8 + 1;
  }
  heapString(__return_storage_ptr__,sVar10);
  pcVar5 = (char *)(__return_storage_ptr__->content).size_;
  if (pcVar5 != (char *)0x0) {
    pcVar5 = (__return_storage_ptr__->content).ptr;
  }
  sVar14 = extraout_RDX_00;
  if (bVar12 == 0) {
    __kjCondition = pcVar5;
    if (!bVar2) goto LAB_001cf65d;
    pcVar6 = pcVar5 + 1;
    *pcVar5 = '\\';
    sVar14 = 2;
  }
  else {
    builtin_strncpy(pcVar5,"\\\\?\\",4);
    __kjCondition = pcVar5 + 4;
    if (!bVar2) goto LAB_001cf65d;
    pcVar5[4] = 'U';
    pcVar5[5] = 'N';
    pcVar6 = pcVar5 + 7;
    pcVar5[6] = 'C';
    sVar14 = 8;
  }
  *pcVar6 = '\\';
  __kjCondition = pcVar5 + sVar14;
LAB_001cf65d:
  pSVar8 = (this->parts).ptr;
  pSVar13 = pSVar8 + (this->parts).size_;
  bVar2 = false;
  for (; pSVar8 != pSVar13; pSVar8 = pSVar8 + 1) {
    if (bVar2) {
      *__kjCondition = '\\';
      __kjCondition = __kjCondition + 1;
    }
    sVar10 = (pSVar8->content).size_;
    pPVar11 = (Path *)0x20b013;
    if (sVar10 != 0) {
      pPVar11 = (Path *)(pSVar8->content).ptr;
    }
    part_01.content.ptr = (char *)(sVar10 + (sVar10 == 0));
    part_01.content.size_ = sVar14;
    bVar2 = Path::isWin32Special(pPVar11,part_01);
    pcVar5 = __kjCondition;
    _kjCondition_1.value = !bVar2;
    if (_kjCondition_1.value) {
      pcVar6 = (char *)(pSVar8->content).size_;
      __src = pcVar6;
      if (pcVar6 != (char *)0x0) {
        __src = (pSVar8->content).ptr;
      }
      __n = pcVar6 + -1;
      if (pcVar6 == (char *)0x0) {
        __n = (char *)0x0;
      }
      memcpy(__kjCondition,__src,(size_t)__n);
      sVar14 = (pSVar8->content).size_;
      lVar3 = sVar14 - 1;
      if (sVar14 == 0) {
        lVar3 = 0;
      }
      __kjCondition = pcVar5 + lVar3;
      sVar14 = extraout_RDX_01;
    }
    else {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[38],kj::String_const&>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0xfd,FAILED,"!Path::isWin32Special(p)",
                 "_kjCondition,\"path cannot contain DOS reserved name\", p",&_kjCondition_1,
                 (char (*) [38])"path cannot contain DOS reserved name",pSVar8);
      uVar4 = 0;
      while( true ) {
        sVar14 = (pSVar8->content).size_;
        uVar7 = 0;
        if (sVar14 != 0) {
          uVar7 = sVar14 - 1;
        }
        if (uVar7 <= uVar4) break;
        *__kjCondition = '|';
        uVar4 = uVar4 + 1;
        __kjCondition = __kjCondition + 1;
      }
      kj::_::Debug::Fault::~Fault(&f);
      sVar14 = extraout_RDX_02;
    }
    bVar2 = true;
  }
  sVar14 = (__return_storage_ptr__->content).size_;
  pcVar5 = (__return_storage_ptr__->content).ptr + (sVar14 - 1);
  if (sVar14 == 0) {
    pcVar5 = (char *)0x0;
  }
  f.exception = (Exception *)&_kjCondition;
  if (__kjCondition == pcVar5) {
    lVar9 = 0;
    lVar3 = sVar14 - 1;
    if (sVar14 == 0) {
      lVar3 = lVar9;
    }
    for (; lVar3 != lVar9; lVar9 = lVar9 + 1) {
      if (((__return_storage_ptr__->content).ptr[lVar9] == ':') &&
         ((ulong)bVar12 * 4 + 1 != lVar9 || !absolute)) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[80],kj::String&>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x117,FAILED,(char *)0x0,
                   "\"colons are prohibited in win32 paths to avoid triggering alternate data streams\", result"
                   ,(char (*) [80])
                    "colons are prohibited in win32 paths to avoid triggering alternate data streams"
                   ,__return_storage_ptr__);
        (__return_storage_ptr__->content).ptr[lVar9] = '|';
        kj::_::Debug::Fault::~Fault(&f);
      }
    }
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<char*&,char*>&>
            ((Fault *)&_kjCondition_1,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
             ,0x10a,FAILED,"ptr == result.end()","_kjCondition,",
             (DebugComparison<char_*&,_char_*> *)&f);
  kj::_::Debug::Fault::fatal((Fault *)&_kjCondition_1);
}

Assistant:

String PathPtr::toWin32StringImpl(bool absolute, bool forApi) const {
  if (parts.size() == 0) {
    // Special-case empty path.
    KJ_REQUIRE(!absolute, "absolute path is missing disk designator") {
      break;
    }
    return absolute ? kj::str("\\\\") : kj::str(".");
  }

  bool isUncPath = false;
  if (absolute) {
    if (Path::isWin32Drive(parts[0])) {
      // It's a win32 drive
    } else if (Path::isNetbiosName(parts[0])) {
      isUncPath = true;
    } else {
      KJ_FAIL_REQUIRE("absolute win32 path must start with drive letter or netbios host name",
                      parts[0]);
    }
  } else {
    // Currently we do nothing differently in the forApi case for relative paths.
    forApi = false;
  }

  size_t size = forApi
      ? (isUncPath ? 8 : 4) + (parts.size() - 1)
      : (isUncPath ? 2 : 0) + (parts.size() - 1);
  for (auto& p: parts) size += p.size();

  String result = heapString(size);

  char* ptr = result.begin();

  if (forApi) {
    *ptr++ = '\\';
    *ptr++ = '\\';
    *ptr++ = '?';
    *ptr++ = '\\';
    if (isUncPath) {
      *ptr++ = 'U';
      *ptr++ = 'N';
      *ptr++ = 'C';
      *ptr++ = '\\';
    }
  } else {
    if (isUncPath) {
      *ptr++ = '\\';
      *ptr++ = '\\';
    }
  }

  bool leadingSlash = false;
  for (auto& p: parts) {
    if (leadingSlash) *ptr++ = '\\';
    leadingSlash = true;

    KJ_REQUIRE(!Path::isWin32Special(p), "path cannot contain DOS reserved name", p) {
      // Recover by blotting out the name with invalid characters which Win32 syscalls will reject.
      for (size_t i = 0; i < p.size(); i++) {
        *ptr++ = '|';
      }
      goto skip;
    }

    memcpy(ptr, p.begin(), p.size());
    ptr += p.size();
  skip:;
  }

  KJ_ASSERT(ptr == result.end());

  // Check for colons (other than in drive letter), which on NTFS would be interpreted as an
  // "alternate data stream", which can lead to surprising results. If we want to support ADS, we
  // should do so using an explicit API. Note that this check also prevents a relative path from
  // appearing to start with a drive letter.
  for (size_t i: kj::indices(result)) {
    if (result[i] == ':') {
      if (absolute && i == (forApi ? 5 : 1)) {
        // False alarm: this is the drive letter.
      } else {
        KJ_FAIL_REQUIRE(
            "colons are prohibited in win32 paths to avoid triggering alternate data streams",
            result) {
          // Recover by using a different character which we know Win32 syscalls will reject.
          result[i] = '|';
          break;
        }
      }
    }
  }

  return result;
}